

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O2

void __thiscall soplex::DIdxSet::~DIdxSet(DIdxSet *this)

{
  ~DIdxSet(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

DIdxSet::~DIdxSet()
{
   if(idx)
      spx_free(idx);
}